

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_picotls(void)

{
  ptls_lookup_certificate_t lc;
  ptls_lookup_certificate_t local_8;
  
  subtest("hmac-sha256",test_hmac_sha256);
  subtest("hkdf",test_hkdf);
  subtest("aead-aes128gcm",test_aes128gcm);
  local_8.cb = lookup_certificate;
  lc_orig = ctx_peer->lookup_certificate;
  ctx_peer->lookup_certificate = &local_8;
  subtest("full-handshake",test_full_handshake);
  subtest("resumption",test_resumption);
  ctx_peer->lookup_certificate = lc_orig;
  return;
}

Assistant:

void test_picotls(void)
{
    subtest("hmac-sha256", test_hmac_sha256);
    subtest("hkdf", test_hkdf);
    subtest("aead-aes128gcm", test_aes128gcm);

    ptls_lookup_certificate_t lc = {lookup_certificate};
    lc_orig = ctx_peer->lookup_certificate;
    ctx_peer->lookup_certificate = &lc;

    subtest("full-handshake", test_full_handshake);
    subtest("resumption", test_resumption);

    ctx_peer->lookup_certificate = lc_orig;
}